

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_functions.cc
# Opt level: O0

float __thiscall
quantileloss::getUpdate
          (quantileloss *this,float prediction,float label,float update_scale,float pred_per_update)

{
  float local_38;
  float local_34;
  float normal;
  float err;
  float pred_per_update_local;
  float update_scale_local;
  float label_local;
  float prediction_local;
  quantileloss *this_local;
  float local_4;
  
  local_34 = label - prediction;
  if ((local_34 != 0.0) || (NAN(local_34))) {
    if (local_34 <= 0.0) {
      if (-(1.0 - this->tau) * update_scale * pred_per_update <= local_34) {
        local_38 = local_34 / pred_per_update;
      }
      else {
        local_38 = (this->tau - 1.0) * update_scale;
      }
      local_4 = local_38;
    }
    else {
      if (local_34 <= this->tau * update_scale * pred_per_update) {
        local_34 = local_34 / pred_per_update;
      }
      else {
        local_34 = this->tau * update_scale;
      }
      local_4 = local_34;
    }
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

float getUpdate(float prediction, float label, float update_scale, float pred_per_update)
  {
    float err = label - prediction;
    if (err == 0)
      return 0;
    float normal = update_scale * pred_per_update;  // base update size
    if (err > 0)
    {
      normal = tau * normal;
      return (normal < err ? tau * update_scale : err / pred_per_update);
    }
    else
    {
      normal = -(1 - tau) * normal;
      return (normal > err ? (tau - 1) * update_scale : err / pred_per_update);
    }
  }